

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TGAImage.cpp
# Opt level: O3

bool __thiscall TRM::TGAImage::read_tga_file(TGAImage *this,char *filename)

{
  char cVar1;
  bool bVar2;
  size_t sVar3;
  uchar *puVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  ostream *poVar8;
  TGAHeader header;
  ifstream in;
  undefined1 local_232 [2];
  byte local_230;
  ushort local_226;
  ushort local_224;
  byte local_222;
  byte local_221;
  long local_220 [4];
  int aiStack_200 [122];
  
  if (this->data != (uchar *)0x0) {
    operator_delete__(this->data);
  }
  this->data = (uchar *)0x0;
  std::ifstream::ifstream(local_220);
  std::ifstream::open((char *)local_220,(_Ios_Openmode)filename);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"can\'t open file ",0x10);
    if (filename == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10b1f0);
    }
    else {
      sVar3 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,filename,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    std::ifstream::close();
  }
  else {
    std::istream::read((char *)local_220,(long)local_232);
    if (*(int *)((long)aiStack_200 + *(long *)(local_220[0] + -0x18)) == 0) {
      this->width = (uint)local_226;
      this->height = (uint)local_224;
      uVar5 = (uint)(local_222 >> 3);
      this->bytespp = uVar5;
      if (((local_224 != 0 && local_226 != 0) && (local_222 >> 3 < 5)) &&
         ((0x1aU >> uVar5 & 1) != 0)) {
        puVar4 = (uchar *)operator_new__((ulong)((uint)local_224 * (uint)local_226 * uVar5));
        this->data = puVar4;
        if ((local_230 & 0xfe) == 10) {
          bVar2 = load_rle_data(this,(ifstream *)local_220);
          if (bVar2) {
LAB_00103e71:
            if ((local_221 & 0x20) == 0) {
              flip_vertically(this);
            }
            if ((local_221 & 0x10) != 0) {
              flip_horizontally(this);
            }
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->width);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"x",1);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->height);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/",1);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->bytespp << 3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            bVar2 = true;
            std::ifstream::close();
            goto LAB_00103dc6;
          }
LAB_00103e3e:
          std::ifstream::close();
          lVar6 = 0x28;
          pcVar7 = "an error occured while reading the data\n";
          poVar8 = (ostream *)&std::cerr;
        }
        else {
          if ((local_230 & 0xfe) == 2) {
            std::istream::read((char *)local_220,(long)puVar4);
            if (*(int *)((long)aiStack_200 + *(long *)(local_220[0] + -0x18)) == 0)
            goto LAB_00103e71;
            goto LAB_00103e3e;
          }
          std::ifstream::close();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"unknown file format ",0x14);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(uint)local_230);
          lVar6 = 1;
          pcVar7 = "\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,lVar6);
        goto LAB_00103dc4;
      }
      std::ifstream::close();
      lVar6 = 0x20;
      pcVar7 = "bad bpp (or width/height) value\n";
    }
    else {
      std::ifstream::close();
      lVar6 = 0x2a;
      pcVar7 = "an error occured while reading the header\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar6);
  }
LAB_00103dc4:
  bVar2 = false;
LAB_00103dc6:
  std::ifstream::~ifstream(local_220);
  return bVar2;
}

Assistant:

bool TGAImage::read_tga_file(const char *filename) {
  if (data) delete[] data;
  data = NULL;
  std::ifstream in;
  in.open(filename, std::ios::binary);
  if (!in.is_open()) {
    std::cerr << "can't open file " << filename << "\n";
    in.close();
    return false;
  }
  TGAHeader header;
  in.read((char *)&header, sizeof(header));
  if (!in.good()) {
    in.close();
    std::cerr << "an error occured while reading the header\n";
    return false;
  }
  width = header.width;
  height = header.height;
  bytespp = header.bitsperpixel >> 3;
  if (width <= 0 || height <= 0 ||
      (bytespp != GRAYSCALE && bytespp != RGB && bytespp != RGBA)) {
    in.close();
    std::cerr << "bad bpp (or width/height) value\n";
    return false;
  }
  unsigned long nbytes = bytespp * width * height;
  data = new unsigned char[nbytes];
  if (3 == header.datatypecode || 2 == header.datatypecode) {
    in.read((char *)data, nbytes);
    if (!in.good()) {
      in.close();
      std::cerr << "an error occured while reading the data\n";
      return false;
    }
  } else if (10 == header.datatypecode || 11 == header.datatypecode) {
    if (!load_rle_data(in)) {
      in.close();
      std::cerr << "an error occured while reading the data\n";
      return false;
    }
  } else {
    in.close();
    std::cerr << "unknown file format " << (int)header.datatypecode << "\n";
    return false;
  }
  if (!(header.imagedescriptor & 0x20)) {
    flip_vertically();
  }
  if (header.imagedescriptor & 0x10) {
    flip_horizontally();
  }
  std::cerr << width << "x" << height << "/" << bytespp * 8 << "\n";
  in.close();
  return true;
}